

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

node_pred * recall_tree_ns::find_or_create(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  node_pred *pnVar2;
  node_pred *pnVar3;
  node_pred newls;
  node_pred local_20;
  
  pnVar1 = (b->nodes)._begin;
  pnVar3 = pnVar1[cn].preds._begin;
  pnVar2 = pnVar1[cn].preds._end;
  if (pnVar3 != pnVar2) {
    do {
      if (pnVar3->label == (ec->l).multi.label) break;
      pnVar3 = pnVar3 + 1;
    } while (pnVar3 != pnVar2);
  }
  if (pnVar3 == pnVar1[cn].preds._end) {
    local_20.label = (uint32_t)(ec->l).simple.label;
    local_20.label_count = 0.0;
    v_array<recall_tree_ns::node_pred>::push_back(&pnVar1[cn].preds,&local_20);
    pnVar3 = (b->nodes)._begin[cn].preds._end + -1;
  }
  return pnVar3;
}

Assistant:

node_pred* find_or_create(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  if (ls == b.nodes[cn].preds.end())
  {
    node_pred newls(ec.l.multi.label);
    b.nodes[cn].preds.push_back(newls);
    ls = b.nodes[cn].preds.end() - 1;
  }

  return ls;
}